

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QAsn1Element>::emplace<QAsn1Element_const&>
          (QMovableArrayOps<QAsn1Element> *this,qsizetype i,QAsn1Element *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QAsn1Element> *in_RSI;
  QArrayDataPointer<QAsn1Element> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QAsn1Element tmp;
  QAsn1Element *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar6;
  GrowthPosition where;
  Inserter local_50;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QAsn1Element>::needsDetach
                    ((QArrayDataPointer<QAsn1Element> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QAsn1Element> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QAsn1Element>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QAsn1Element>::end
                ((QArrayDataPointer<QAsn1Element> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QAsn1Element::QAsn1Element
                ((QAsn1Element *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121574;
    }
    if ((in_RSI == (QArrayDataPointer<QAsn1Element> *)0x0) &&
       (qVar3 = QArrayDataPointer<QAsn1Element>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QAsn1Element>::begin((QArrayDataPointer<QAsn1Element> *)0x12142a);
      QAsn1Element::QAsn1Element
                ((QAsn1Element *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121574;
    }
  }
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QAsn1Element::QAsn1Element
            ((QAsn1Element *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QAsn1Element> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QAsn1Element> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QAsn1Element>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
             (QAsn1Element **)in_RDI,
             (QArrayDataPointer<QAsn1Element> *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff80),
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    Inserter::~Inserter(&local_50);
  }
  else {
    QArrayDataPointer<QAsn1Element>::begin((QArrayDataPointer<QAsn1Element> *)0x121508);
    QAsn1Element::QAsn1Element
              ((QAsn1Element *)CONCAT17(uVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QAsn1Element::~QAsn1Element((QAsn1Element *)0x121574);
LAB_00121574:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }